

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
getTypeHierarchy(UA_NodeStore *ns,UA_Node *rootRef,UA_Boolean inverse,UA_NodeId **typeHierarchy,
                size_t *typeHierarchySize)

{
  UA_Boolean UVar1;
  UA_StatusCode UVar2;
  UA_NodeId *dst;
  UA_NodeId *pUVar3;
  ulong uVar4;
  UA_NodeStoreEntry **ppUVar5;
  UA_Node *pUVar6;
  UA_ReferenceNode *pUVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 local_a8 [8];
  UA_NodeId hasSubtypeNodeId;
  ulong local_60;
  ulong local_40;
  
  hasSubtypeNodeId.identifier.string.data = (UA_Byte *)ns;
  dst = (UA_NodeId *)malloc(0x1e0);
  if (dst == (UA_NodeId *)0x0) {
    UVar2 = 0x80030000;
  }
  else {
    UVar2 = UA_copy(rootRef,dst,UA_TYPES + 0x10);
    if (UVar2 == 0) {
      local_a8._0_2_ = 0;
      stack0xffffffffffffff5c = 0x2d00000000;
      local_60 = 0x14;
      local_40 = 0;
      uVar9 = 0;
      pUVar6 = rootRef;
      do {
        sVar8 = pUVar6->referencesSize;
        if (sVar8 != 0) {
          uVar4 = 0;
          do {
            pUVar7 = pUVar6->references;
            if ((pUVar7[uVar4].isInverse == inverse) &&
               (UVar1 = UA_NodeId_equal((UA_NodeId *)local_a8,&pUVar7[uVar4].referenceTypeId), UVar1
               )) {
              uVar10 = 0;
              pUVar3 = dst;
              do {
                UVar1 = UA_NodeId_equal(&pUVar7[uVar4].targetId.nodeId,pUVar3);
                if (UVar1) goto LAB_0011b50b;
                uVar10 = uVar10 + 1;
                pUVar3 = pUVar3 + 1;
              } while (uVar10 <= uVar9);
              uVar10 = uVar9 + 1;
              if (local_60 <= uVar10) {
                pUVar3 = (UA_NodeId *)realloc(dst,local_60 * 0x30);
                if (pUVar3 == (UA_NodeId *)0x0) {
                  UVar2 = 0x80030000;
                  uVar10 = uVar9;
                  goto LAB_0011b5b2;
                }
                local_60 = local_60 * 2;
                pUVar7 = pUVar6->references;
                dst = pUVar3;
              }
              UVar2 = UA_copy(&pUVar7[uVar4].targetId,dst + uVar10,UA_TYPES + 0x10);
              if (UVar2 != 0) {
LAB_0011b5b2:
                UA_Array_delete(dst,uVar10,UA_TYPES + 0x10);
                return UVar2;
              }
              sVar8 = pUVar6->referencesSize;
              uVar9 = uVar10;
            }
LAB_0011b50b:
            uVar4 = uVar4 + 1;
          } while (uVar4 < sVar8);
        }
        if (uVar9 < local_40 + 1) {
LAB_0011b57e:
          *typeHierarchy = dst;
          *typeHierarchySize = uVar9 + 1;
          return 0;
        }
        pUVar3 = dst + local_40;
        local_40 = local_40 + 1;
        while( true ) {
          pUVar3 = pUVar3 + 1;
          ppUVar5 = findNode((UA_NodeStore *)hasSubtypeNodeId.identifier.string.data,pUVar3);
          if ((ppUVar5 != (UA_NodeStoreEntry **)0x0) &&
             (((*ppUVar5)->node).nodeClass == rootRef->nodeClass)) break;
          local_40 = local_40 + 1;
          if (uVar9 < local_40) goto LAB_0011b57e;
        }
        pUVar6 = &(*ppUVar5)->node;
      } while( true );
    }
    free(dst);
  }
  return UVar2;
}

Assistant:

UA_StatusCode
getTypeHierarchy(UA_NodeStore *ns, const UA_Node *rootRef, UA_Boolean inverse,
                 UA_NodeId **typeHierarchy, size_t *typeHierarchySize) {
    size_t results_size = 20; // probably too big, but saves mallocs
    UA_NodeId *results = UA_malloc(sizeof(UA_NodeId) * results_size);
    if(!results)
        return UA_STATUSCODE_BADOUTOFMEMORY;

    UA_StatusCode retval = UA_NodeId_copy(&rootRef->nodeId, &results[0]);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_free(results);
        return retval;
    }

    const UA_Node *node = rootRef;
    size_t idx = 0; /* Current index (contains NodeId of node) */
    size_t last = 0; /* Index of the last element in the array */
    const UA_NodeId hasSubtypeNodeId = UA_NODEID_NUMERIC(0, UA_NS0ID_HASSUBTYPE);
    while(true) {
        for(size_t i = 0; i < node->referencesSize; ++i) {
            /* is the reference relevant? */
            if(node->references[i].isInverse != inverse ||
               !UA_NodeId_equal(&hasSubtypeNodeId, &node->references[i].referenceTypeId))
                continue;

            /* is the target already considered? (multi-inheritance) */
            UA_Boolean duplicate = false;
            for(size_t j = 0; j <= last; ++j) {
                if(UA_NodeId_equal(&node->references[i].targetId.nodeId, &results[j])) {
                    duplicate = true;
                    break;
                }
            }
            if(duplicate)
                continue;

            /* increase array length if necessary */
            if(last + 1 >= results_size) {
                                UA_NodeId *new_results =
                                    UA_realloc(results, sizeof(UA_NodeId) * results_size * 2);
                                if(!new_results) {
                                    retval = UA_STATUSCODE_BADOUTOFMEMORY;
                                    break;
                                }
                                results = new_results;
                                results_size *= 2;
            }

            /* copy new nodeid to the end of the list */
            retval = UA_NodeId_copy(&node->references[i].targetId.nodeId, &results[++last]);
            if(retval != UA_STATUSCODE_GOOD)
                break;
        }

        /* Get the next node */
    next:
        ++idx;
        if(idx > last || retval != UA_STATUSCODE_GOOD)
            break;
        node = UA_NodeStore_get(ns, &results[idx]);
        if(!node || node->nodeClass != rootRef->nodeClass)
            goto next;
    }

    if(retval != UA_STATUSCODE_GOOD) {
        UA_Array_delete(results, last, &UA_TYPES[UA_TYPES_NODEID]);
        return retval;
    }

    *typeHierarchy = results;
    *typeHierarchySize = last + 1;
    return UA_STATUSCODE_GOOD;
}